

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

void opengv::generateRandom2D2DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,translations_t *camOffsets,rotations_t *camRotations,
               size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *bearingVectors1,bearingVectors_t *bearingVectors2,
               vector<int,_std::allocator<int>_> *camCorrespondences1,
               vector<int,_std::allocator<int>_> *camCorrespondences2,MatrixXd *gt)

{
  ulong uVar1;
  size_type sVar2;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_R8;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_R9;
  Matrix<double,_3,_3,_0,_3,_3> *in_XMM0_Qa;
  double *scalar;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_ZMM1 [64];
  undefined8 in_stack_00000008;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_00000010;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_00000018;
  point_t bodyPoint;
  point_t p;
  rotation_t camRotation_1;
  translation_t camOffset_1;
  size_t i_2;
  size_t numberOutliers;
  point_t bodyPoint2;
  point_t bodyPoint1;
  rotation_t camRotation;
  translation_t camOffset;
  size_t i_1;
  size_t camCorrespondence;
  size_t numberCams;
  size_t i;
  double maxDepth;
  double minDepth;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffa08;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffffa10;
  Matrix<double,_3,_3,_0,_3,_3> *in_stack_fffffffffffffa18;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffa20;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_stack_fffffffffffffa28;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffa30;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffa38;
  double *in_stack_fffffffffffffa50;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffa58;
  double in_stack_fffffffffffffb20;
  double in_stack_fffffffffffffb28;
  undefined8 local_478;
  Vector3d *in_stack_fffffffffffffc80;
  double in_stack_fffffffffffffc88;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_58;
  
  dVar4 = in_ZMM1._0_8_;
  local_58 = 0;
  while( true ) {
    uVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xb0f561);
    if (uVar1 <= local_58) break;
    in_ZMM1 = ZEXT864(0x4010000000000000);
    generateRandomPoint(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffa20,
               (Index)in_stack_fffffffffffffa18);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffa10,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa08);
    local_58 = local_58 + 1;
  }
  sVar2 = std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::size(in_R8);
  local_b8 = 0;
  local_c0 = 0;
  while( true ) {
    auVar5 = in_ZMM1._0_16_;
    uVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0xb0f61f);
    if (uVar1 <= local_c0) break;
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_R8,local_b8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa08);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator[](in_R9,local_b8);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              (in_stack_fffffffffffffa10,(Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa08)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa08);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffa20,
               (Index)in_stack_fffffffffffffa18);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
              (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
              ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffa28,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffa20);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffa08);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa08);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffa20,
               (Index)in_stack_fffffffffffffa18);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator-
              (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
              ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffa28,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffa20);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa20 = in_stack_00000010;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa38,
               in_stack_fffffffffffffa30);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffa08);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffa10,(value_type *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa28 = in_stack_00000018;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa38,
               in_stack_fffffffffffffa30);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffa08);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)in_stack_fffffffffffffa10,(value_type *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa30 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         std::
         vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)in_stack_00000010,local_c0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000010,local_c0);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000010,local_c0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa38 =
         (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
         std::
         vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)in_stack_00000018,local_c0);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000018,local_c0);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm(in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
              (in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000018,local_c0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffffa08);
    in_ZMM1 = ZEXT1664((undefined1  [16])0x0);
    if (0.0 < (double)in_XMM0_Qa) {
      in_stack_fffffffffffffa10 = in_XMM0_Qa;
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_00000010,local_c0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa08);
      addNoise(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_00000010,local_c0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa18 = in_XMM0_Qa;
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_00000018,local_c0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa08);
      addNoise(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    *)in_stack_00000018,local_c0);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
                 (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa08);
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               (value_type *)in_stack_fffffffffffffa08);
    local_b8 = local_b8 + 1;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10,
               (value_type *)in_stack_fffffffffffffa08);
    if (sVar2 - 1 < local_b8) {
      local_b8 = 0;
    }
    local_c0 = local_c0 + 1;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar4;
  auVar5 = vcvtusi2sd_avx512f(auVar5,in_stack_00000008);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar4 * auVar5._0_8_;
  auVar5 = vroundsd_avx(auVar3,auVar6,9);
  uVar1 = vcvttsd2usi_avx512f(auVar5);
  for (local_478 = 0; local_478 < uVar1; local_478 = local_478 + 1) {
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[](in_R8,local_b8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa08);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::operator[](in_R9,local_b8);
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              (in_stack_fffffffffffffa10,(Matrix<double,_3,_3,_0,_3,_3> *)in_stack_fffffffffffffa08)
    ;
    generateRandomPoint(in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa38,
               in_stack_fffffffffffffa30);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>>::operator*
              ((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
               in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffa08);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
              ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa38,
               in_stack_fffffffffffffa30);
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000018,local_478);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_fffffffffffffa08);
    in_stack_fffffffffffffa08 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         std::
         vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)in_stack_00000018,local_478);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000018,local_478);
    scalar = (double *)
             Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       (in_stack_fffffffffffffa08);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(in_stack_fffffffffffffa58,scalar);
    std::
    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)in_stack_00000018,local_478);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffa10,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)in_stack_fffffffffffffa08);
  }
  return;
}

Assistant:

void
opengv::generateRandom2D2DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & bearingVectors1,
    bearingVectors_t & bearingVectors2,
    std::vector<int> & camCorrespondences1,
    std::vector<int> & camCorrespondences2,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 2D3D-correspondences by looping through the cameras
  size_t numberCams = camOffsets.size();
  size_t camCorrespondence = 0;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //get the camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //get the point in viewpoint 1
    point_t bodyPoint1 = rotation1.transpose()*(gt.col(i) - position1);

    //get the point in viewpoint 2
    point_t bodyPoint2 = rotation2.transpose()*(gt.col(i) - position2);

    //get the point in the camera in viewpoint 1
    bearingVectors1.push_back(camRotation.transpose()*(bodyPoint1 - camOffset));

    //get the point in the camera in viewpoint 2
    bearingVectors2.push_back(camRotation.transpose()*(bodyPoint2 - camOffset));

    //normalize the bearing-vectors
    bearingVectors1[i] = bearingVectors1[i] / bearingVectors1[i].norm();
    bearingVectors2[i] = bearingVectors2[i] / bearingVectors2[i].norm();

    //add noise
    if( noise > 0.0 )
    {
      bearingVectors1[i] = addNoise(noise,bearingVectors1[i]);
      bearingVectors2[i] = addNoise(noise,bearingVectors2[i]);
    }

    //push back the camera correspondences
    camCorrespondences1.push_back(camCorrespondence);
    camCorrespondences2.push_back(camCorrespondence++);
    if(camCorrespondence > (numberCams - 1) )
      camCorrespondence = 0;
  }

  //add outliers
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //get the corresponding camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //create random point
    point_t p = generateRandomPoint(8,4);

    //project this point into viewpoint 2
    point_t bodyPoint = rotation2.transpose()*(p - position2);

    //project this point into the corresponding camera in viewpoint 2
    //and use as outlier
    bearingVectors2[i] = camRotation.transpose()*(bodyPoint - camOffset);

    //normalize the bearing vector
    bearingVectors2[i] = bearingVectors2[i] / bearingVectors2[i].norm();
  }
}